

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vfsq(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t dofs;
  uint32_t aofs;
  DisasJumpType DVar4;
  code *fn;
  
  tcg_ctx = s->uc->tcg_ctx;
  DVar4 = DISAS_NORETURN;
  uVar1 = get_field1(s,FLD_O_m3,FLD_C_i3);
  uVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  if ((uVar2 & 7) == 0 && (uVar1 & 0xff) == 3) {
    fn = gen_helper_gvec_vfsq64s;
    if ((uVar2 & 8) == 0) {
      fn = gen_helper_gvec_vfsq64;
    }
    DVar4 = DISAS_NEXT;
    iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
    dofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar3);
    tcg_gen_gvec_2_ptr_s390x(tcg_ctx,dofs,aofs,tcg_ctx->cpu_env,0x10,0x10,0,fn);
  }
  else {
    gen_program_exception(s,6);
  }
  return DVar4;
}

Assistant:

static DisasJumpType op_vfsq(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m3);
    const uint8_t m4 = get_field(s, m4);
    gen_helper_gvec_2_ptr *fn = gen_helper_gvec_vfsq64;

    if (fpf != FPF_LONG || extract32(m4, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (extract32(m4, 3, 1)) {
        fn = gen_helper_gvec_vfsq64s;
    }
    gen_gvec_2_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}